

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_log_formatter.hpp
# Opt level: O1

void __thiscall
boost::unit_test::output::junit_log_formatter::junit_log_formatter(junit_log_formatter *this)

{
  _Rb_tree_header *p_Var1;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar2;
  
  (this->super_unit_test_log_formatter).m_log_level = log_all_errors;
  (this->super_unit_test_log_formatter)._vptr_unit_test_log_formatter =
       (_func_int **)&PTR__junit_log_formatter_001caa38;
  p_Var1 = &(this->map_tests)._M_t._M_impl.super__Rb_tree_header;
  (this->map_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->map_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->map_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->map_tests)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->map_tests)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->runner_log_entry).system_out.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->runner_log_entry;
  (this->runner_log_entry).system_out.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->runner_log_entry;
  (this->runner_log_entry).system_out.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  plVar2 = &(this->runner_log_entry).system_err;
  (this->runner_log_entry).system_err.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar2;
  (this->runner_log_entry).system_err.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar2;
  (this->runner_log_entry).system_err.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->runner_log_entry).skipping_reason._M_dataplus._M_p =
       (pointer)&(this->runner_log_entry).skipping_reason.field_2;
  (this->runner_log_entry).skipping_reason._M_string_length = 0;
  (this->runner_log_entry).skipping_reason.field_2._M_local_buf[0] = '\0';
  (this->runner_log_entry).assertion_entries.
  super__Vector_base<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry,_std::allocator<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->runner_log_entry).assertion_entries.
  super__Vector_base<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry,_std::allocator<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->runner_log_entry).assertion_entries.
           super__Vector_base<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry,_std::allocator<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->runner_log_entry).assertion_entries.
           super__Vector_base<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry,_std::allocator<boost::unit_test::output::junit_impl::junit_log_helper::assertion_entry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->list_path_to_root).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->list_path_to_root;
  (this->list_path_to_root).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->list_path_to_root;
  (this->list_path_to_root).super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  _M_node._M_size = 0;
  this->m_display_build_info = false;
  (this->super_unit_test_log_formatter).m_log_level = log_successful_tests;
  this->m_log_level_internal = log_messages;
  return;
}

Assistant:

unit_test_log_formatter()
        : m_log_level(log_all_errors)
    {}